

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Cluster.c
# Opt level: O3

int Llb_ManComputeBestQuant(Llb_Mtr_t *p)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  
  uVar9 = 0xffffffff;
  if (2 < p->nCols) {
    uVar8 = (ulong)(p->nCols - 1);
    iVar7 = -100000;
    uVar10 = 2;
    uVar6 = 1;
    do {
      uVar1 = uVar6 + 1;
      if (uVar1 < uVar8) {
        piVar4 = p->pColSums;
        iVar2 = piVar4[uVar6];
        uVar11 = uVar10;
        do {
          if ((((iVar2 != 0) && (iVar5 = p->pMan->pPars->nClusterMax, iVar2 <= iVar5)) &&
              (iVar3 = piVar4[uVar11], iVar3 != 0)) && (iVar3 <= iVar5)) {
            iVar5 = Llb_ManComputeCommonQuant(p,(int)uVar6,(uint)uVar11);
            if (0 < iVar5 && iVar7 < iVar5) {
              iVar7 = iVar5;
              uVar9 = (int)uVar6 << 0x10 | (uint)uVar11;
            }
          }
          uVar11 = uVar11 + 1;
        } while (uVar8 != uVar11);
      }
      uVar10 = uVar10 + 1;
      uVar6 = uVar1;
    } while (uVar1 != uVar8);
  }
  return uVar9;
}

Assistant:

int Llb_ManComputeBestQuant( Llb_Mtr_t * p )
{
    int i, k, WeightBest = -100000, WeightCur, RetValue = -1;
    for ( i = 1; i < p->nCols-1; i++ )
    for ( k = i+1; k < p->nCols-1; k++ )
    {
        if ( p->pColSums[i] == 0 || p->pColSums[i] > p->pMan->pPars->nClusterMax )
            continue;
        if ( p->pColSums[k] == 0 || p->pColSums[k] > p->pMan->pPars->nClusterMax )
            continue;

        WeightCur = Llb_ManComputeCommonQuant( p, i, k );
        if ( WeightCur <= 0 )
            continue;
        if ( WeightBest < WeightCur )
        {
            WeightBest = WeightCur;
            RetValue   = (i << 16) | k;
        }
    }
//    printf( "Choosing best quant Weight %4d\n", WeightCur );
    return RetValue;
}